

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

uint32_t IntegerLog2(uint64_t n)

{
  uint32_t l;
  uint64_t n_local;
  
  l = (uint32_t)(n == 0 || (n & n - 1) != 0);
  n_local = n;
  while (n_local = n_local >> 1, n_local != 0) {
    l = l + 1;
  }
  return l;
}

Assistant:

uint32_t IntegerLog2(uint64_t n) {
  // TODO: Add support for hardware instruction
  uint32_t l = ISPOWOF2(n) ? 0 : 1;
  while (n >>= 1)
    ++l;
  return l;
}